

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int defineAttribute(ELEMENT_TYPE *type,ATTRIBUTE_ID *attId,int isCdata,int isId,XML_Char *value,
                   XML_Parser parser)

{
  long *plVar1;
  long lVar2;
  DEFAULT_ATTRIBUTE *pDVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = type->nDefaultAtts;
  if (isId == 0 && value == (XML_Char *)0x0) {
LAB_0014fe34:
    if (uVar4 == type->allocDefaultAtts) {
      if (uVar4 == 0) {
        type->allocDefaultAtts = 8;
        pDVar3 = (DEFAULT_ATTRIBUTE *)(**(code **)((long)parser + 0x18))(0xc0);
      }
      else {
        type->allocDefaultAtts = uVar4 * 2;
        pDVar3 = (DEFAULT_ATTRIBUTE *)
                 (**(code **)((long)parser + 0x20))(type->defaultAtts,(long)(int)uVar4 * 0x30);
      }
      type->defaultAtts = pDVar3;
      if (pDVar3 == (DEFAULT_ATTRIBUTE *)0x0) {
        return 0;
      }
      uVar4 = type->nDefaultAtts;
    }
    else {
      pDVar3 = type->defaultAtts;
    }
    pDVar3[(int)uVar4].id = attId;
    pDVar3[(int)uVar4].value = value;
    pDVar3[(int)uVar4].isCdata = (char)isCdata;
    if (isCdata == 0) {
      attId->maybeTokenized = '\x01';
    }
    type->nDefaultAtts = uVar4 + 1;
  }
  else {
    uVar5 = 0;
    if (0 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
    }
    lVar2 = 0;
    do {
      if (uVar5 * 0x18 + 0x18 == lVar2 + 0x18) {
        if (((isId != 0) && (type->idAtt == (ATTRIBUTE_ID *)0x0)) && (attId->xmlns == '\0')) {
          type->idAtt = attId;
        }
        goto LAB_0014fe34;
      }
      plVar1 = (long *)((long)&type->defaultAtts->id + lVar2);
      lVar2 = lVar2 + 0x18;
    } while ((ATTRIBUTE_ID *)*plVar1 != attId);
  }
  return 1;
}

Assistant:

static int
defineAttribute(ELEMENT_TYPE *type, ATTRIBUTE_ID *attId, int isCdata,
                int isId, const XML_Char *value, XML_Parser parser)
{
  DEFAULT_ATTRIBUTE *att;
  if (value || isId) {
    /* The handling of default attributes gets messed up if we have
       a default which duplicates a non-default. */
    int i;
    for (i = 0; i < type->nDefaultAtts; i++)
      if (attId == type->defaultAtts[i].id)
        return 1;
    if (isId && !type->idAtt && !attId->xmlns)
      type->idAtt = attId;
  }
  if (type->nDefaultAtts == type->allocDefaultAtts) {
    if (type->allocDefaultAtts == 0) {
      type->allocDefaultAtts = 8;
      type->defaultAtts = MALLOC(type->allocDefaultAtts*sizeof(DEFAULT_ATTRIBUTE));
    }
    else {
      type->allocDefaultAtts *= 2;
      type->defaultAtts = REALLOC(type->defaultAtts,
                                  type->allocDefaultAtts*sizeof(DEFAULT_ATTRIBUTE));
    }
    if (!type->defaultAtts)
      return 0;
  }
  att = type->defaultAtts + type->nDefaultAtts;
  att->id = attId;
  att->value = value;
  att->isCdata = isCdata;
  if (!isCdata)
    attId->maybeTokenized = 1;
  type->nDefaultAtts += 1;
  return 1;
}